

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O2

void __thiscall Vgm_Emu::mute_voices_(Vgm_Emu *this,int mask)

{
  Blip_Buffer *pBVar1;
  uint uVar2;
  uint uVar3;
  Blip_Buffer *b;
  double new_unit;
  
  Classic_Emu::mute_voices_((Classic_Emu *)this,mask);
  pBVar1 = &(this->super_Vgm_Emu_Impl).blip_buf;
  (this->super_Vgm_Emu_Impl).dac_synth.impl.buf = pBVar1;
  (this->super_Vgm_Emu_Impl).dac_synth.impl.last_amp = 0;
  if (this->uses_fm == true) {
    b = (Blip_Buffer *)0x0;
    if (-1 < (char)mask) {
      b = pBVar1;
    }
    Sms_Apu::output(&(this->super_Vgm_Emu_Impl).psg,b);
    if ((this->super_Vgm_Emu_Impl).ym2612.last_time != -1) {
      if ((mask & 0x40U) == 0) {
        new_unit = (this->super_Vgm_Emu_Impl).super_Classic_Emu.super_Music_Emu.gain_ *
                   0.001306640625;
      }
      else {
        new_unit = 0.0;
      }
      Blip_Synth_::volume_unit(&(this->super_Vgm_Emu_Impl).dac_synth.impl,new_unit);
      Ym2612_Emu::mute_voices(&(this->super_Vgm_Emu_Impl).ym2612.super_Ym2612_Emu,mask);
    }
    if ((this->super_Vgm_Emu_Impl).ym2413.last_time != -1) {
      uVar2 = mask & 0x3fU | 0x1e0;
      if ((mask & 0x20U) == 0) {
        uVar2 = mask & 0x3fU;
      }
      uVar3 = uVar2 + 0x3e00;
      if ((mask & 0x40U) == 0) {
        uVar3 = uVar2;
      }
      Ym2413_Emu::mute_voices(&(this->super_Vgm_Emu_Impl).ym2413.super_Ym2413_Emu,uVar3);
      return;
    }
  }
  return;
}

Assistant:

void Vgm_Emu::mute_voices_( int mask )
{
	Classic_Emu::mute_voices_( mask );
	dac_synth.output( &blip_buf );
	if ( uses_fm )
	{
		psg.output( (mask & 0x80) ? 0 : &blip_buf );
		if ( ym2612.enabled() )
		{
			dac_synth.volume( (mask & 0x40) ? 0.0 : 0.1115 / 256 * fm_gain * gain() );
			ym2612.mute_voices( mask );
		}
		
		if ( ym2413.enabled() )
		{
			int m = mask & 0x3F;
			if ( mask & 0x20 )
				m |= 0x01E0; // channels 5-8
			if ( mask & 0x40 )
				m |= 0x3E00;
			ym2413.mute_voices( m );
		}
	}
}